

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgraphelq3dd.cpp
# Opt level: O0

int64_t __thiscall TPZGraphElQ3dd::EqNum(TPZGraphElQ3dd *this,TPZVec<int> *co)

{
  int iVar1;
  int iVar2;
  int64_t iVar3;
  int *piVar4;
  int iVar5;
  TPZVec<int> *in_RSI;
  long in_RDI;
  int imax;
  int res;
  
  iVar2 = TPZGraphMesh::Res(*(TPZGraphMesh **)(in_RDI + 0x10));
  iVar5 = (1 << ((byte)iVar2 & 0x1f)) + 1;
  iVar3 = TPZGraphNode::FirstPoint(*(TPZGraphNode **)(in_RDI + 0x20));
  piVar4 = TPZVec<int>::operator[](in_RSI,2);
  iVar2 = *piVar4;
  piVar4 = TPZVec<int>::operator[](in_RSI,1);
  iVar1 = *piVar4;
  piVar4 = TPZVec<int>::operator[](in_RSI,0);
  return iVar3 + iVar5 * iVar5 * iVar2 + (long)(iVar1 * iVar5) + (long)*piVar4;
}

Assistant:

int64_t TPZGraphElQ3dd::EqNum(TPZVec<int> &co) {
	int res = fGraphMesh->Res();
	int imax = (1<<res)+1;
	
	return fConnect->FirstPoint()+imax*imax*co[2]+co[1]*imax+co[0];
}